

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O1

void __thiscall
BasicContainer::BasicContainer
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  pointer ppBVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_40;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_001b6be8;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&this->list,list);
  this->root = (treenode *)0x0;
  local_58 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[11]>
            (&console,(char (*) [20])"building SAH BVH of",&local_58,(char (*) [11])"primitives");
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&local_40,list);
  build(this,&local_40,&this->root);
  if (local_40.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
       super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_58);
  (this->bound).z1 = local_48;
  (this->bound).z2 = fStack_44;
  (this->bound).x1 = (float)local_58;
  (this->bound).x2 = local_58._4_4_;
  (this->bound).y1 = fStack_50;
  (this->bound).y2 = fStack_4c;
  ppBVar9 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(list->
                        super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar9)) {
    uVar10 = 1;
    do {
      (*(ppBVar9[uVar10]->super_Primitive)._vptr_Primitive[1])(&local_58);
      fVar1 = (this->bound).x1;
      fVar2 = (this->bound).x2;
      fVar8 = (float)local_58;
      if (fVar1 <= (float)local_58) {
        fVar8 = fVar1;
      }
      fVar3 = local_58._4_4_;
      if (local_58._4_4_ <= fVar2) {
        fVar3 = fVar2;
      }
      fVar4 = (this->bound).y1;
      fVar11 = fStack_50;
      if (fVar4 <= fStack_50) {
        fVar11 = fVar4;
      }
      fVar5 = (this->bound).y2;
      fVar12 = fStack_4c;
      if (fStack_4c <= fVar5) {
        fVar12 = fVar5;
      }
      fVar6 = (this->bound).z1;
      fVar13 = local_48;
      if (fVar6 <= local_48) {
        fVar13 = fVar6;
      }
      fVar7 = (this->bound).z2;
      fVar14 = fStack_44;
      if (fStack_44 <= fVar7) {
        fVar14 = fVar7;
      }
      (this->bound).x1 =
           (float)(~-(uint)NAN(fVar1) & (uint)fVar8 | -(uint)NAN(fVar1) & (uint)(float)local_58);
      (this->bound).x2 =
           (float)(~-(uint)NAN(fVar2) & (uint)fVar3 | -(uint)NAN(fVar2) & (uint)local_58._4_4_);
      (this->bound).y1 =
           (float)(~-(uint)NAN(fVar4) & (uint)fVar11 | -(uint)NAN(fVar4) & (uint)fStack_50);
      (this->bound).y2 =
           (float)(~-(uint)NAN(fVar5) & (uint)fVar12 | -(uint)NAN(fVar5) & (uint)fStack_4c);
      (this->bound).z1 =
           (float)(~-(uint)NAN(fVar6) & (uint)fVar13 | -(uint)NAN(fVar6) & (uint)local_48);
      (this->bound).z2 =
           (float)(~-(uint)NAN(fVar7) & (uint)fVar14 | -(uint)NAN(fVar7) & (uint)fStack_44);
      uVar10 = uVar10 + 1;
      ppBVar9 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(list->
                                    super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar9 >> 3
                             ));
  }
  return;
}

Assistant:

BasicContainer(const std::vector<BasicPrimitive*>& list): list(list)
	{
		console.log("building SAH BVH of", list.size(), "primitives");
		build(list, root);
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
	}